

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

void __thiscall
gl4cts::GPUShaderFP64Test2::prepareUniforms
          (GPUShaderFP64Test2 *this,shaderStage shader_stage,uniformTypeDetails *uniform_type,
          programInfo *program_info)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  GLuint n_uniforms;
  deUint32 dVar4;
  undefined4 extraout_var;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  GLuint GVar8;
  GLint buffer_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> uniform_buffer_data;
  uniformDetails uniform_details;
  GLuint in_stack_ffffffffffffff78;
  GLint local_7c;
  GPUShaderFP64Test2 *local_78;
  GLuint local_6c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  long local_48;
  uniformDetails local_3c;
  
  local_78 = (GPUShaderFP64Test2 *)CONCAT44(local_78._4_4_,shader_stage);
  local_7c = 0;
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_48 = CONCAT44(extraout_var,iVar3);
  uVar1 = uniform_type->m_n_rows;
  uVar7 = uniform_type->m_n_columns * uVar1;
  GVar8 = program_info->m_program_object_id;
  n_uniforms = getAmountUniforms(this,(shaderStage)local_78,uniform_type);
  local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78 = this;
  local_6c = GVar8;
  inspectProgram(this,GVar8,n_uniforms,uniform_type,&local_7c,&local_3c,in_stack_ffffffffffffff78);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_68,(long)local_7c);
  lVar2 = local_48;
  if (0 < (int)n_uniforms) {
    GVar8 = 0;
    iVar3 = 1;
    do {
      if (uVar7 != 0) {
        uVar6 = 0;
        do {
          *(double *)
           (local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start +
           ((int)(uVar6 / uVar1) * local_3c.m_matrix_stride +
            GVar8 * local_3c.m_array_stride + local_3c.m_offset + (int)(uVar6 % (ulong)uVar1) * 8))
               = (double)(uint)(iVar3 + (int)uVar6);
          uVar5 = (int)uVar6 + 1;
          uVar6 = (ulong)uVar5;
        } while (uVar7 != uVar5);
        iVar3 = iVar3 + uVar5;
      }
      GVar8 = GVar8 + 1;
    } while (GVar8 != n_uniforms);
  }
  (**(code **)(local_48 + 0x40))(0x8a11,local_78->m_uniform_buffer_id);
  dVar4 = (**(code **)(lVar2 + 0x800))();
  glu::checkError(dVar4,"BindBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x1053);
  (**(code **)(lVar2 + 0x150))
            (0x8a11,(long)local_7c,
             local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,0x88e4);
  dVar4 = (**(code **)(lVar2 + 0x800))();
  glu::checkError(dVar4,"BufferData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x1056);
  (**(code **)(lVar2 + 0x50))(0x8a11,0,local_78->m_uniform_buffer_id,0,(long)local_7c);
  dVar4 = (**(code **)(lVar2 + 0x800))();
  glu::checkError(dVar4,"BindBufferRange",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x105a);
  (**(code **)(lVar2 + 0x15d0))(local_6c,0,0);
  dVar4 = (**(code **)(lVar2 + 0x800))();
  glu::checkError(dVar4,"UniformBlockBinding",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x105d);
  if (local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void GPUShaderFP64Test2::prepareUniforms(shaderStage shader_stage, const uniformTypeDetails& uniform_type,
										 const Utils::programInfo& program_info) const
{
	glw::GLint				  buffer_size	 = 0;
	glw::GLuint				  element_ordinal = 1;
	const glw::Functions&	 gl			  = m_context.getRenderContext().getFunctions();
	const glw::GLuint		  n_columns		  = uniform_type.m_n_columns;
	const glw::GLuint		  n_rows		  = uniform_type.m_n_rows;
	const glw::GLuint		  n_elements	  = n_columns * n_rows;
	uniformDetails			  uniform_details;
	const glw::GLuint		  program_id = program_info.m_program_object_id;
	const glw::GLint		  n_uniforms = getAmountUniforms(shader_stage, uniform_type);
	std::vector<glw::GLubyte> uniform_buffer_data;
	glw::GLuint				  uniform_block_index = 0;

	/* Get uniform details */
	inspectProgram(program_id, n_uniforms, uniform_type, buffer_size, uniform_details, uniform_block_index);

	/* Uniform offset and strides */
	const glw::GLuint array_stride   = uniform_details.m_array_stride;
	const glw::GLuint matrix_stride  = uniform_details.m_matrix_stride;
	const glw::GLuint uniform_offset = uniform_details.m_offset;

	/* Prepare storage for buffer data */
	uniform_buffer_data.resize(buffer_size);

	/* Prepare uniform data */
	for (glw::GLint i = 0; i < n_uniforms; ++i)
	{
		const glw::GLuint array_entry_offset = uniform_offset + i * array_stride;

		for (glw::GLuint element = 0; element < n_elements; ++element, ++element_ordinal)
		{
			const glw::GLuint   column		 = element / n_rows;
			const glw::GLuint   column_elem  = element % n_rows;
			const glw::GLdouble value		 = element_ordinal;
			const glw::GLuint   value_offset = static_cast<glw::GLuint>(array_entry_offset + column * matrix_stride +
																	  column_elem * sizeof(glw::GLdouble));
			glw::GLdouble* value_dst = (glw::GLdouble*)&uniform_buffer_data[value_offset];

			*value_dst = value;
		}
	}

	/* Update uniform buffer with new set of data */
	gl.bindBuffer(GL_UNIFORM_BUFFER, m_uniform_buffer_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindBuffer");

	gl.bufferData(GL_UNIFORM_BUFFER, buffer_size, &uniform_buffer_data[0], GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BufferData");

	/* Bind uniform block to uniform buffer */
	gl.bindBufferRange(GL_UNIFORM_BUFFER, 0 /* index */, m_uniform_buffer_id, 0 /* offset */, buffer_size);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindBufferRange");

	gl.uniformBlockBinding(program_id, uniform_block_index, 0 /* binding */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UniformBlockBinding");
}